

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.cxx
# Opt level: O0

void __thiscall
Time::runNested(Time *this,unsigned_long_long events,StochasticEventGenerator *eventSource,
               unsigned_long_long maxSteps,unsigned_long_long runs,DataCollector *runHelper,
               ostream *log)

{
  reference pvVar1;
  ulong local_70;
  unsigned_long_long r;
  value_type_conflict4 local_58;
  undefined1 local_50 [8];
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> runNumbers;
  DataCollector *runHelper_local;
  unsigned_long_long runs_local;
  unsigned_long_long maxSteps_local;
  StochasticEventGenerator *eventSource_local;
  unsigned_long_long events_local;
  Time *this_local;
  
  runNumbers.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)runHelper;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_50);
  local_58 = 0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_50,&local_58);
  for (local_70 = 0; local_70 < runs; local_70 = local_70 + 1) {
    pvVar1 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_50,
                        0);
    *pvVar1 = local_70;
    if (runNumbers.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      (**(code **)*runNumbers.
                   super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage)
                (runNumbers.
                 super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage,local_50);
    }
    run(this,events,eventSource,maxSteps,log,true);
    if (runNumbers.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      (**(code **)(*runNumbers.
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 8))
                (runNumbers.
                 super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage,local_50);
    }
  }
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_50);
  return;
}

Assistant:

void Time::runNested(unsigned long long events, StochasticEventGenerator *eventSource, unsigned long long maxSteps, unsigned long long runs, DataCollector *runHelper, ostream &log )
{
	vector<unsigned long long> runNumbers;
	runNumbers.push_back(0);
	for (unsigned long long r=0; r<runs; ++r) {
		runNumbers[0] = r;
		if (runHelper)
			runHelper->beforeRun(runNumbers);
		run(events, eventSource, maxSteps, log);
		if (runHelper)
			runHelper->afterRun(runNumbers);
	}
}